

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureWrapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  TestNode *pTVar4;
  long *plVar5;
  TextureWrapCase *pTVar6;
  long lVar7;
  long lVar8;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  size_type *psVar11;
  pointer pbVar12;
  long lVar13;
  CompressedTexFormat format;
  bool bVar14;
  long lVar15;
  long lVar16;
  anon_struct_16_3_1dd0bf0d *paVar17;
  bool bVar18;
  pointer *ppbVar19;
  string name;
  string name_4;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  anon_struct_16_3_1dd0bf0d formatSizes [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  IVec3 blockSize;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  int iVar3;
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"rgba8",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar13 = 0;
  bVar2 = true;
  do {
    bVar14 = bVar2;
    lVar8 = 0;
    do {
      lVar7 = 0;
      do {
        lVar15 = 0;
        bVar2 = true;
        do {
          bVar18 = bVar2;
          potFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&potFilenames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>((string *)&potFilenames,0x1aee929);
          plVar5 = (long *)std::__cxx11::string::append((char *)&potFilenames);
          plVar10 = plVar5 + 2;
          if ((long *)*plVar5 == plVar10) {
            local_178 = *plVar10;
            lStack_170 = plVar5[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *plVar10;
            local_188 = (long *)*plVar5;
          }
          local_180 = plVar5[1];
          *plVar5 = (long)plVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_168.field_2._M_allocated_capacity = *psVar11;
            local_168.field_2._8_8_ = plVar5[3];
          }
          else {
            local_168.field_2._M_allocated_capacity = *psVar11;
            local_168._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_168._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148.field_2._8_8_ = plVar5[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar11;
            local_148._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_148._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128.field_2._8_8_ = plVar5[3];
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_128._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
          name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar11) {
            name_4.field_2._M_allocated_capacity = *psVar11;
            name_4.field_2._8_8_ = plVar5[3];
          }
          else {
            name_4.field_2._M_allocated_capacity = *psVar11;
            name_4._M_dataplus._M_p = (pointer)*plVar5;
          }
          name_4._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&name_4);
          formatSizes[0].name = (char *)(formatSizes + 1);
          plVar10 = plVar5 + 2;
          if ((long *)*plVar5 == plVar10) {
            formatSizes[1].name = (char *)*plVar10;
            formatSizes[1]._8_8_ = plVar5[3];
          }
          else {
            formatSizes[1].name = (char *)*plVar10;
            formatSizes[0].name = (char *)*plVar5;
          }
          formatSizes[0]._8_8_ = plVar5[1];
          *plVar5 = (long)plVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)formatSizes);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar11 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar11) {
            name.field_2._M_allocated_capacity = *psVar11;
            name.field_2._8_8_ = plVar5[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar11;
            name._M_dataplus._M_p = (pointer)*plVar5;
          }
          name._M_string_length = plVar5[1];
          *plVar5 = (long)psVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_struct_16_3_1dd0bf0d *)formatSizes[0].name != formatSizes + 1) {
            operator_delete(formatSizes[0].name,(ulong)(formatSizes[1].name + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name_4._M_dataplus._M_p != &name_4.field_2) {
            operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&potFilenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(potFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((potFilenames.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          pTVar6 = (TextureWrapCase *)operator_new(0x140);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          TextureWrapCase::TextureWrapCase
                    (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
                     ,pCVar1->m_renderCtx,pCVar1->m_contextInfo,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,0x1908,0x1401,
                     init::wrapModes[lVar8].mode,init::wrapModes[lVar7].mode,
                     init::filteringModes[lVar15].mode,init::filteringModes[lVar15].mode,
                     init::rgba8Sizes[lVar13].width,init::rgba8Sizes[lVar13].height);
          tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar15 = 1;
          bVar2 = false;
        } while (bVar18);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar13 = 1;
    bVar2 = false;
  } while (bVar14);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"etc1",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_mip_0.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
             &name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  lVar13 = 0;
  do {
    lVar8 = 0;
    do {
      lVar7 = 0;
      bVar2 = true;
      do {
        bVar14 = bVar2;
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,0x1aee929);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_168.field_2._M_allocated_capacity = *psVar11;
          local_168.field_2._8_8_ = plVar5[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar11;
          local_168._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_168._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148.field_2._8_8_ = plVar5[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_148._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128.field_2._8_8_ = plVar5[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_128._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
        name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar11) {
          name_4.field_2._M_allocated_capacity = *psVar11;
          name_4.field_2._8_8_ = plVar5[3];
        }
        else {
          name_4.field_2._M_allocated_capacity = *psVar11;
          name_4._M_dataplus._M_p = (pointer)*plVar5;
        }
        name_4._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&name_4);
        formatSizes[0].name = (char *)(formatSizes + 1);
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          formatSizes[1].name = (char *)*plVar10;
          formatSizes[1]._8_8_ = plVar5[3];
        }
        else {
          formatSizes[1].name = (char *)*plVar10;
          formatSizes[0].name = (char *)*plVar5;
        }
        formatSizes[0]._8_8_ = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)formatSizes);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar11) {
          name.field_2._M_allocated_capacity = *psVar11;
          name.field_2._8_8_ = plVar5[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar11;
          name._M_dataplus._M_p = (pointer)*plVar5;
        }
        name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_struct_16_3_1dd0bf0d *)formatSizes[0].name != formatSizes + 1) {
          operator_delete(formatSizes[0].name,(ulong)(formatSizes[1].name + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name_4._M_dataplus._M_p != &name_4.field_2) {
          operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        TextureWrapCase::TextureWrapCase
                  (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar1->m_renderCtx,pCVar1->m_contextInfo,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar13].mode,
                   init::wrapModes[lVar8].mode,init::filteringModes[lVar7].mode,
                   init::filteringModes[lVar7].mode,&potFilenames);
        tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar7 = 1;
        bVar2 = false;
      } while (bVar14);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_113x89.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
             &name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  lVar13 = 0;
  do {
    lVar8 = 0;
    do {
      lVar7 = 0;
      bVar2 = true;
      do {
        bVar14 = bVar2;
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,0x1aee929);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_168.field_2._M_allocated_capacity = *psVar11;
          local_168.field_2._8_8_ = plVar5[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar11;
          local_168._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_168._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148.field_2._8_8_ = plVar5[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_148._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128.field_2._8_8_ = plVar5[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_128._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
        name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar11) {
          name_4.field_2._M_allocated_capacity = *psVar11;
          name_4.field_2._8_8_ = plVar5[3];
        }
        else {
          name_4.field_2._M_allocated_capacity = *psVar11;
          name_4._M_dataplus._M_p = (pointer)*plVar5;
        }
        name_4._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&name_4);
        formatSizes[0].name = (char *)(formatSizes + 1);
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          formatSizes[1].name = (char *)*plVar10;
          formatSizes[1]._8_8_ = plVar5[3];
        }
        else {
          formatSizes[1].name = (char *)*plVar10;
          formatSizes[0].name = (char *)*plVar5;
        }
        formatSizes[0]._8_8_ = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)formatSizes);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar11) {
          name.field_2._M_allocated_capacity = *psVar11;
          name.field_2._8_8_ = plVar5[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar11;
          name._M_dataplus._M_p = (pointer)*plVar5;
        }
        name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_struct_16_3_1dd0bf0d *)formatSizes[0].name != formatSizes + 1) {
          operator_delete(formatSizes[0].name,(ulong)(formatSizes[1].name + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name_4._M_dataplus._M_p != &name_4.field_2) {
          operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        TextureWrapCase::TextureWrapCase
                  (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar1->m_renderCtx,pCVar1->m_contextInfo,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar13].mode,
                   init::wrapModes[lVar8].mode,init::filteringModes[lVar7].mode,
                   init::filteringModes[lVar7].mode,&npotFilenames);
        tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar7 = 1;
        bVar2 = false;
      } while (bVar14);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  lVar13 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_38 = lVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,init::etc2Formats[lVar13].name,
               glcts::fixed_sample_locations_values + 1);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    lVar8 = 0;
    bVar2 = true;
    do {
      bVar14 = bVar2;
      lVar7 = 0;
      do {
        lVar15 = 0;
        do {
          lVar16 = 0;
          bVar2 = true;
          do {
            bVar18 = bVar2;
            ppbVar19 = &potFilenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            potFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)&potFilenames,0x1aee929);
            plVar5 = (long *)std::__cxx11::string::append((char *)&potFilenames);
            local_188 = &local_178;
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_178 = *plVar10;
              lStack_170 = plVar5[3];
            }
            else {
              local_178 = *plVar10;
              local_188 = (long *)*plVar5;
            }
            local_180 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_168.field_2._M_allocated_capacity = *psVar11;
              local_168.field_2._8_8_ = plVar5[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar11;
              local_168._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_168._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_148.field_2._M_allocated_capacity = *psVar11;
              local_148.field_2._8_8_ = plVar5[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar11;
              local_148._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_148._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar5[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_128._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
            psVar11 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar11) {
              name_4.field_2._M_allocated_capacity = *psVar11;
              name_4.field_2._8_8_ = plVar5[3];
              name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
            }
            else {
              name_4.field_2._M_allocated_capacity = *psVar11;
              name_4._M_dataplus._M_p = (pointer)*plVar5;
            }
            name_4._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&name_4);
            formatSizes[0].name = (char *)(formatSizes + 1);
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              formatSizes[1].name = (char *)*plVar10;
              formatSizes[1]._8_8_ = plVar5[3];
            }
            else {
              formatSizes[1].name = (char *)*plVar10;
              formatSizes[0].name = (char *)*plVar5;
            }
            formatSizes[0]._8_8_ = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)formatSizes);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar11 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar11) {
              name.field_2._M_allocated_capacity = *psVar11;
              name.field_2._8_8_ = plVar5[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar11;
              name._M_dataplus._M_p = (pointer)*plVar5;
            }
            name._M_string_length = plVar5[1];
            *plVar5 = (long)psVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_struct_16_3_1dd0bf0d *)formatSizes[0].name != formatSizes + 1) {
              operator_delete(formatSizes[0].name,(ulong)(formatSizes[1].name + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name_4._M_dataplus._M_p != &name_4.field_2) {
              operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            if (potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar19) {
              operator_delete(potFilenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((potFilenames.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + 1));
            }
            pTVar6 = (TextureWrapCase *)operator_new(0x140);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            TextureWrapCase::TextureWrapCase
                      (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                              m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                       name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                       init::etc2Formats[lVar13].format,init::wrapModes[lVar7].mode,
                       init::wrapModes[lVar15].mode,init::filteringModes[lVar16].mode,
                       init::filteringModes[lVar16].mode,init::etc2Sizes[lVar8].width,
                       init::etc2Sizes[lVar8].height);
            tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar16 = 1;
            bVar2 = false;
          } while (bVar18);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar8 = 1;
      bVar2 = false;
    } while (bVar14);
    lVar13 = local_38 + 1;
  } while (lVar13 != 10);
  format = COMPRESSEDTEXFORMAT_ETC1_RGB8;
  do {
    bVar2 = tcu::isAstcFormat(format);
    iVar3 = (int)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      tcu::getBlockPixelSize((tcu *)&blockSize,format);
      local_188 = (long *)CONCAT44(local_188._4_4_,blockSize.m_data[0]);
      de::toString<int>(&local_148,(int *)&local_188);
      std::operator+(&local_128,"astc_",&local_148);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        name_4.field_2._M_allocated_capacity = *psVar11;
        name_4.field_2._8_8_ = plVar5[3];
        name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
      }
      else {
        name_4.field_2._M_allocated_capacity = *psVar11;
        name_4._M_dataplus._M_p = (pointer)*plVar5;
      }
      name_4._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      potFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(potFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,blockSize.m_data[1]);
      de::toString<int>(&local_168,(int *)&potFilenames);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     formatSizes,&name_4,&local_168);
      tcu::isAstcSRGBFormat(format);
      plVar5 = (long *)std::__cxx11::string::append((char *)formatSizes);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        name.field_2._M_allocated_capacity = *psVar11;
        name.field_2._8_8_ = plVar5[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar11;
        name._M_dataplus._M_p = (pointer)*plVar5;
      }
      name._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_struct_16_3_1dd0bf0d *)formatSizes[0].name != formatSizes + 1) {
        operator_delete(formatSizes[0].name,(ulong)(formatSizes[1].name + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_4._M_dataplus._M_p != &name_4.field_2) {
        operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1);
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar4);
      formatSizes[0].name = "divisible";
      formatSizes[0].height = blockSize.m_data[1] * 10;
      formatSizes[0].width = blockSize.m_data[0] * 10;
      formatSizes[1].name = "not_divisible";
      formatSizes[1].height = blockSize.m_data[1] * 10 + 1;
      formatSizes[1].width = blockSize.m_data[0] * 10 + 1;
      paVar17 = formatSizes;
      bVar2 = true;
      do {
        bVar14 = bVar2;
        lVar13 = 0;
        do {
          lVar8 = 0;
          do {
            lVar7 = 0;
            bVar2 = true;
            do {
              bVar18 = bVar2;
              ppbVar19 = &potFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_58[0] = local_48;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_58,0x1aee929);
              plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&npotFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar12 = (pointer)(plVar5 + 2);
              if ((pointer)*plVar5 == pbVar12) {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar12->_M_dataplus)._M_p;
              }
              else {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar12->_M_dataplus)._M_p;
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
              }
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
              *plVar5 = (long)pbVar12;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
              pbVar12 = (pointer)(plVar5 + 2);
              if ((pointer)*plVar5 == pbVar12) {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar12->_M_dataplus)._M_p;
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar19;
              }
              else {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar12->_M_dataplus)._M_p;
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
              }
              potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
              *plVar5 = (long)pbVar12;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&potFilenames);
              local_188 = &local_178;
              plVar10 = plVar5 + 2;
              if ((long *)*plVar5 == plVar10) {
                local_178 = *plVar10;
                lStack_170 = plVar5[3];
              }
              else {
                local_178 = *plVar10;
                local_188 = (long *)*plVar5;
              }
              local_180 = plVar5[1];
              *plVar5 = (long)plVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_168.field_2._M_allocated_capacity = *psVar11;
                local_168.field_2._8_8_ = plVar5[3];
              }
              else {
                local_168.field_2._M_allocated_capacity = *psVar11;
                local_168._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_168._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_148.field_2._M_allocated_capacity = *psVar11;
                local_148.field_2._8_8_ = plVar5[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar11;
                local_148._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_148._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_128.field_2._M_allocated_capacity = *psVar11;
                local_128.field_2._8_8_ = plVar5[3];
              }
              else {
                local_128.field_2._M_allocated_capacity = *psVar11;
                local_128._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_128._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
              name_4._M_dataplus._M_p = (pointer)&name_4.field_2;
              psVar11 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar11) {
                name_4.field_2._M_allocated_capacity = *psVar11;
                name_4.field_2._8_8_ = plVar5[3];
              }
              else {
                name_4.field_2._M_allocated_capacity = *psVar11;
                name_4._M_dataplus._M_p = (pointer)*plVar5;
              }
              name_4._M_string_length = plVar5[1];
              *plVar5 = (long)psVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if (local_188 != &local_178) {
                operator_delete(local_188,local_178 + 1);
              }
              if (potFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar19) {
                operator_delete(potFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((potFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&npotFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(npotFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((npotFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
              pTVar6 = (TextureWrapCase *)operator_new(0x140);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              TextureWrapCase::TextureWrapCase
                        (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                         name_4._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,format,
                         init::wrapModes[lVar13].mode,init::wrapModes[lVar8].mode,
                         init::filteringModes[lVar7].mode,init::filteringModes[lVar7].mode,
                         paVar17->width,paVar17->height);
              tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name_4._M_dataplus._M_p != &name_4.field_2) {
                operator_delete(name_4._M_dataplus._M_p,name_4.field_2._M_allocated_capacity + 1);
              }
              lVar7 = 1;
              bVar2 = false;
            } while (bVar18);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        paVar17 = formatSizes + 1;
        bVar2 = false;
      } while (bVar14);
      paVar9 = &name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != paVar9) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        paVar9 = extraout_RAX;
      }
      iVar3 = (int)paVar9;
    }
    format = format + COMPRESSEDTEXFORMAT_EAC_R11;
  } while (format != COMPRESSEDTEXFORMAT_LAST);
  return iVar3;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// RGBA8 cases.
	{
		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} rgba8Sizes[] =
		{
			{ "pot",		64, 128 },
			{ "npot",		63, 112 }
		};

		{
			TestCaseGroup* const rgba8Group = new TestCaseGroup(m_context, "rgba8", "");
			addChild(rgba8Group);

			FOR_EACH(size,		rgba8Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + rgba8Sizes[size].name;
					rgba8Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															 GL_RGBA, GL_UNSIGNED_BYTE,
															 wrapModes[wrapS].mode,
															 wrapModes[wrapT].mode,
															 filteringModes[filter].mode, filteringModes[filter].mode,
															 rgba8Sizes[size].width, rgba8Sizes[size].height));

				}))));
		}
	}

	// ETC1 cases.
	{
		TestCaseGroup* const etc1Group = new TestCaseGroup(m_context, "etc1", "");
		addChild(etc1Group);

		// Power-of-two ETC1 texture
		std::vector<std::string> potFilenames;
		potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														potFilenames));

			})));

		std::vector<std::string> npotFilenames;
		npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

		// NPOT ETC1 texture
		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_npot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														npotFilenames));
			})));
	}

	// ETC-2 (and EAC) cases.
	{
		static const struct
		{
			const char*			name;
			CompressedTexFormat	format;
		} etc2Formats[] =
		{
			{ "eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
			{ "eac_signed_r11",						tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
			{ "eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
			{ "eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
			{ "etc2_rgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
			{ "etc2_srgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
			{ "etc2_rgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
			{ "etc2_srgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
			{ "etc2_eac_rgba8",						tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
			{ "etc2_eac_srgb8_alpha8",				tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
		};

		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} etc2Sizes[] =
		{
			{ "pot",	64,		128	},
			{ "npot",	123,	107	}
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
		{
			TestCaseGroup* const formatGroup = new TestCaseGroup(m_context, etc2Formats[formatNdx].name, "");
			addChild(formatGroup);

			FOR_EACH(size,		etc2Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + etc2Sizes[size].name;
					formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															  etc2Formats[formatNdx].format,
															  wrapModes[wrapS].mode,
															  wrapModes[wrapT].mode,
															  filteringModes[filter].mode, filteringModes[filter].mode,
															  etc2Sizes[size].width, etc2Sizes[size].height));
				}))));
		}
	}

	// ASTC cases.
	{
		for (int formatI = 0; formatI < tcu::COMPRESSEDTEXFORMAT_LAST; formatI++)
		{
			const CompressedTexFormat format = (CompressedTexFormat)formatI;

			if (!tcu::isAstcFormat(format))
				continue;

			{
				const tcu::IVec3		blockSize		= tcu::getBlockPixelSize(format);
				const string			formatName		= "astc_" + de::toString(blockSize.x()) + "x" + de::toString(blockSize.y()) + (tcu::isAstcSRGBFormat(format) ? "_srgb" : "");
				TestCaseGroup* const	formatGroup		= new TestCaseGroup(m_context, formatName.c_str(), "");
				addChild(formatGroup);

				DE_ASSERT(blockSize.z() == 1);

				// \note This array is NOT static.
				const struct
				{
					const char*		name;
					int				width;
					int				height;
				} formatSizes[] =
				{
					{ "divisible",		blockSize.x()*10,		blockSize.y()*10	},
					{ "not_divisible",	blockSize.x()*10+1,		blockSize.y()*10+1	},
				};

				FOR_EACH(size,		formatSizes,
				FOR_EACH(wrapS,		wrapModes,
				FOR_EACH(wrapT,		wrapModes,
				FOR_EACH(filter,	filteringModes,
					{
						string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + formatSizes[size].name;
						formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
																  format,
																  wrapModes[wrapS].mode,
																  wrapModes[wrapT].mode,
																  filteringModes[filter].mode, filteringModes[filter].mode,
																  formatSizes[size].width, formatSizes[size].height));
					}))));
			}
		}
	}
}